

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O2

void __thiscall
cursespp::ListWindow::ListWindow
          (ListWindow *this,shared_ptr<cursespp::IScrollAdapter> *adapter,IWindow *parent)

{
  __shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>);
  ScrollableWindow::ScrollableWindow
            (&this->super_ScrollableWindow,(shared_ptr<cursespp::IScrollAdapter> *)&_Stack_38,parent
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListWindow_001bfb30;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ListWindow_001bfda0;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler
       = (_func_int **)&PTR__ListWindow_001bfdd0;
  (this->super_ScrollableWindow).super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListWindow_001bfdf8;
  (this->super_ScrollableWindow).super_IScrollable._vptr_IScrollable =
       (_func_int **)&PTR__ListWindow_001bfe20;
  (this->super_ScrollableWindow).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListWindow_001bfe70;
  sigslot::
  signal3<cursespp::ListWindow_*,_unsigned_long,_unsigned_long,_sigslot::multi_threaded_local>::
  signal3(&this->SelectionChanged);
  sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::signal2
            (&this->Invalidated);
  sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::signal2
            (&this->EntryActivated);
  sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::signal2
            (&this->EntryContextMenu);
  this->showScrollbar = true;
  (this->scrollPosition).firstVisibleEntryIndex = 0;
  (this->scrollPosition).visibleEntryCount = 0;
  (this->scrollPosition).lineCount = 0;
  (this->scrollPosition).totalEntries = 0;
  (this->scrollPosition).logicalIndex = 0;
  this->selectedIndex = 0;
  *(undefined8 *)&(this->decorator).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->decorator).super__Function_base._M_functor + 8) = 0;
  (this->decorator).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->decorator)._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

ListWindow::ListWindow(std::shared_ptr<IScrollAdapter> adapter, IWindow *parent)
: ScrollableWindow(adapter, parent)
, selectedIndex(0)
, showScrollbar(true) {

}